

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int find_address_ranges(backtrace_state *state,libbacktrace_base_address base_address,
                       dwarf_buf *unit_buf,dwarf_sections *dwarf_sections,int is_bigendian,
                       dwarf_data *altlink,backtrace_error_callback error_callback,void *data,
                       unit *u,unit_addrs_vector *addrs,dwarf_tag *unit_tag)

{
  dwarf_attribute dVar1;
  bool bVar2;
  int iVar3;
  uint64_t code_00;
  abbrev *paVar4;
  undefined1 local_e8 [8];
  attr_val val;
  size_t i;
  undefined1 auStack_c8 [4];
  int have_comp_dir_val;
  attr_val comp_dir_val;
  undefined1 auStack_b0 [4];
  int have_name_val;
  attr_val name_val;
  pcrange pcrange;
  abbrev *abbrev;
  uint64_t code;
  dwarf_data *altlink_local;
  int is_bigendian_local;
  dwarf_sections *dwarf_sections_local;
  dwarf_buf *unit_buf_local;
  backtrace_state *state_local;
  libbacktrace_base_address base_address_local;
  
  do {
    if (unit_buf->left == 0) {
      return 1;
    }
    code_00 = read_uleb128(unit_buf);
    if (code_00 == 0) {
      return 1;
    }
    paVar4 = lookup_abbrev(&u->abbrevs,code_00,error_callback,data);
    if (paVar4 == (abbrev *)0x0) {
      return 0;
    }
    if (unit_tag != (dwarf_tag *)0x0) {
      *unit_tag = paVar4->tag;
    }
    memset(&name_val.u,0,0x38);
    memset(auStack_b0,0,0x10);
    comp_dir_val.u.uint._4_4_ = 0;
    memset(auStack_c8,0,0x10);
    bVar2 = false;
    for (val.u.uint = 0; val.u.uint < paVar4->num_attrs; val.u.string = (char *)(val.u.uint + 1)) {
      iVar3 = read_attribute(paVar4->attrs[val.u.uint].form,paVar4->attrs[val.u.uint].val,unit_buf,
                             u->is_dwarf64,u->version,u->addrsize,dwarf_sections,altlink,
                             (attr_val *)local_e8);
      if (iVar3 == 0) {
        return 0;
      }
      dVar1 = paVar4->attrs[val.u.uint].name;
      if (dVar1 == DW_AT_name) {
        if ((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) {
          name_val.encoding = val.encoding;
          name_val._4_4_ = val._4_4_;
          comp_dir_val.u.uint._4_4_ = 1;
        }
      }
      else if (dVar1 == DW_AT_stmt_list) {
        if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) &&
           ((local_e8._0_4_ == ATTR_VAL_UINT || (local_e8._0_4_ == ATTR_VAL_REF_SECTION)))) {
          u->lineoff = val._0_8_;
        }
      }
      else if (dVar1 - DW_AT_low_pc < 2) {
LAB_0015bb39:
        update_pcrange(paVar4->attrs + val.u.uint,(attr_val *)local_e8,(pcrange *)&name_val.u);
      }
      else if (dVar1 == DW_AT_comp_dir) {
        if ((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) {
          comp_dir_val.encoding = val.encoding;
          comp_dir_val._4_4_ = val._4_4_;
          bVar2 = true;
        }
      }
      else {
        if (dVar1 == DW_AT_ranges) goto LAB_0015bb39;
        if (dVar1 == DW_AT_str_offsets_base) {
          if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) &&
             (local_e8._0_4_ == ATTR_VAL_REF_SECTION)) {
            u->str_offsets_base = val._0_8_;
          }
        }
        else if (dVar1 == DW_AT_addr_base) {
          if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) &&
             (local_e8._0_4_ == ATTR_VAL_REF_SECTION)) {
            u->addr_base = val._0_8_;
          }
        }
        else if (((dVar1 == DW_AT_rnglists_base) &&
                 ((paVar4->tag == DW_TAG_compile_unit || (paVar4->tag == DW_TAG_skeleton_unit)))) &&
                (local_e8._0_4_ == ATTR_VAL_REF_SECTION)) {
          u->rnglists_base = val._0_8_;
        }
      }
    }
    if ((comp_dir_val.u.uint._4_4_ != 0) &&
       (iVar3 = resolve_string(dwarf_sections,u->is_dwarf64,is_bigendian,u->str_offsets_base,
                               (attr_val *)auStack_b0,error_callback,data,&u->filename), iVar3 == 0)
       ) {
      return 0;
    }
    if ((bVar2) &&
       (iVar3 = resolve_string(dwarf_sections,u->is_dwarf64,is_bigendian,u->str_offsets_base,
                               (attr_val *)auStack_c8,error_callback,data,&u->comp_dir), iVar3 == 0)
       ) {
      return 0;
    }
    if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_subprogram)) ||
       (paVar4->tag == DW_TAG_skeleton_unit)) {
      iVar3 = add_ranges(state,dwarf_sections,base_address,is_bigendian,u,name_val.u.uint,
                         (pcrange *)&name_val.u,add_unit_addr,u,error_callback,data,addrs);
      if (iVar3 == 0) {
        return 0;
      }
      if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) &&
         (((int)pcrange.ranges != 0 || (((int)pcrange.lowpc != 0 && ((int)pcrange.highpc != 0))))))
      {
        return 1;
      }
    }
    if ((paVar4->has_children != 0) &&
       (iVar3 = find_address_ranges(state,base_address,unit_buf,dwarf_sections,is_bigendian,altlink,
                                    error_callback,data,u,addrs,(dwarf_tag *)0x0), iVar3 == 0)) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
find_address_ranges (struct backtrace_state *state,
		     struct libbacktrace_base_address base_address,
		     struct dwarf_buf *unit_buf,
		     const struct dwarf_sections *dwarf_sections,
		     int is_bigendian, struct dwarf_data *altlink,
		     backtrace_error_callback error_callback, void *data,
		     struct unit *u, struct unit_addrs_vector *addrs,
		     enum dwarf_tag *unit_tag)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      struct pcrange pcrange;
      struct attr_val name_val;
      int have_name_val;
      struct attr_val comp_dir_val;
      int have_comp_dir_val;
      size_t i;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      if (unit_tag != NULL)
	*unit_tag = abbrev->tag;

      memset (&pcrange, 0, sizeof pcrange);
      memset (&name_val, 0, sizeof name_val);
      have_name_val = 0;
      memset (&comp_dir_val, 0, sizeof comp_dir_val);
      have_comp_dir_val = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, dwarf_sections, altlink, &val))
	    return 0;

	  switch (abbrev->attrs[i].name)
	    {
	    case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
	      update_pcrange (&abbrev->attrs[i], &val, &pcrange);
	      break;

	    case DW_AT_stmt_list:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && (val.encoding == ATTR_VAL_UINT
		      || val.encoding == ATTR_VAL_REF_SECTION))
		u->lineoff = val.u.uint;
	      break;

	    case DW_AT_name:
	      if (abbrev->tag == DW_TAG_compile_unit
		  || abbrev->tag == DW_TAG_skeleton_unit)
		{
		  name_val = val;
		  have_name_val = 1;
		}
	      break;

	    case DW_AT_comp_dir:
	      if (abbrev->tag == DW_TAG_compile_unit
		  || abbrev->tag == DW_TAG_skeleton_unit)
		{
		  comp_dir_val = val;
		  have_comp_dir_val = 1;
		}
	      break;

	    case DW_AT_str_offsets_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->str_offsets_base = val.u.uint;
	      break;

	    case DW_AT_addr_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->addr_base = val.u.uint;
	      break;

	    case DW_AT_rnglists_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->rnglists_base = val.u.uint;
	      break;

	    default:
	      break;
	    }
	}

      // Resolve strings after we're sure that we have seen
      // DW_AT_str_offsets_base.
      if (have_name_val)
	{
	  if (!resolve_string (dwarf_sections, u->is_dwarf64, is_bigendian,
			       u->str_offsets_base, &name_val,
			       error_callback, data, &u->filename))
	    return 0;
	}
      if (have_comp_dir_val)
	{
	  if (!resolve_string (dwarf_sections, u->is_dwarf64, is_bigendian,
			       u->str_offsets_base, &comp_dir_val,
			       error_callback, data, &u->comp_dir))
	    return 0;
	}

      if (abbrev->tag == DW_TAG_compile_unit
	  || abbrev->tag == DW_TAG_subprogram
	  || abbrev->tag == DW_TAG_skeleton_unit)
	{
	  if (!add_ranges (state, dwarf_sections, base_address,
			   is_bigendian, u, pcrange.lowpc, &pcrange,
			   add_unit_addr, (void *) u, error_callback, data,
			   (void *) addrs))
	    return 0;

	  /* If we found the PC range in the DW_TAG_compile_unit or
	     DW_TAG_skeleton_unit, we can stop now.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && (pcrange.have_ranges
		  || (pcrange.have_lowpc && pcrange.have_highpc)))
	    return 1;
	}

      if (abbrev->has_children)
	{
	  if (!find_address_ranges (state, base_address, unit_buf,
				    dwarf_sections, is_bigendian, altlink,
				    error_callback, data, u, addrs, NULL))
	    return 0;
	}
    }

  return 1;
}